

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::pipeline::anon_unknown_0::makeRenderPass
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkFormat colorFormat,VkFormat depthStencilFormat,deUint32 numLayers,
          VkImageLayout initialColorImageLayout,VkImageLayout initialDepthStencilImageLayout)

{
  deUint32 i;
  ulong uVar1;
  ulong __n;
  VkAttachmentStoreOp VVar2;
  long lVar3;
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
  attachmentDescriptions;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> subpasses;
  VkRenderPassCreateInfo renderPassInfo;
  value_type local_ac;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
  depthStencilAttachmentReferences;
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
  colorAttachmentReferences;
  value_type local_54;
  
  local_54.flags = 0;
  local_54.samples = VK_SAMPLE_COUNT_1_BIT;
  local_54.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_54.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  local_54.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  VVar2 = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  local_54.initialLayout = initialColorImageLayout;
  local_54.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  __n = (ulong)numLayers;
  local_54.format = colorFormat;
  local_54.stencilStoreOp = VVar2;
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::vector
            (&attachmentDescriptions,__n,&local_54,(allocator_type *)&renderPassInfo);
  local_ac.flags = 0;
  local_ac.samples = VK_SAMPLE_COUNT_1_BIT;
  local_ac.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_ac.storeOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  local_ac.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  local_ac.initialLayout = initialDepthStencilImageLayout;
  local_ac.finalLayout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  local_ac.format = depthStencilFormat;
  local_ac.stencilStoreOp = VVar2;
  if (depthStencilFormat != VK_FORMAT_UNDEFINED) {
    std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::insert
              (&attachmentDescriptions,
               (const_iterator)
               attachmentDescriptions.
               super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish,__n,&local_ac);
  }
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&colorAttachmentReferences,__n,(allocator_type *)&renderPassInfo);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            (&depthStencilAttachmentReferences,__n,(allocator_type *)&renderPassInfo);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = 0;
  for (uVar1 = 0; __n != uVar1; uVar1 = uVar1 + 1) {
    *(int *)((long)&(colorAttachmentReferences.
                     super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                     ._M_impl.super__Vector_impl_data._M_start)->attachment + lVar3) = (int)uVar1;
    *(undefined4 *)
     ((long)&(colorAttachmentReferences.
              super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
              ._M_impl.super__Vector_impl_data._M_start)->layout + lVar3) = 2;
    *(deUint32 *)
     ((long)&(depthStencilAttachmentReferences.
              super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
              ._M_impl.super__Vector_impl_data._M_start)->attachment + lVar3) =
         numLayers + (int)uVar1;
    renderPassInfo._48_8_ = 0;
    if (depthStencilFormat != VK_FORMAT_UNDEFINED) {
      renderPassInfo._48_8_ =
           (long)&(depthStencilAttachmentReferences.
                   super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                   ._M_impl.super__Vector_impl_data._M_start)->attachment + lVar3;
    }
    *(undefined4 *)
     ((long)&(depthStencilAttachmentReferences.
              super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
              ._M_impl.super__Vector_impl_data._M_start)->layout + lVar3) = 3;
    renderPassInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    renderPassInfo._4_4_ = 0;
    renderPassInfo._32_8_ =
         (long)&(colorAttachmentReferences.
                 super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                 ._M_impl.super__Vector_impl_data._M_start)->attachment + lVar3;
    renderPassInfo.pNext = (void *)((ulong)renderPassInfo.pNext & 0xffffffff00000000);
    renderPassInfo.flags = 0;
    renderPassInfo.attachmentCount = 0;
    renderPassInfo.pAttachments =
         (VkAttachmentDescription *)CONCAT44(renderPassInfo.pAttachments._4_4_,1);
    renderPassInfo.pSubpasses = (VkSubpassDescription *)0x0;
    renderPassInfo.pDependencies =
         (VkSubpassDependency *)((ulong)renderPassInfo.pDependencies & 0xffffffff00000000);
    std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::push_back
              (&subpasses,(value_type *)&renderPassInfo);
    lVar3 = lVar3 + 8;
  }
  renderPassInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassInfo.pNext = (void *)0x0;
  renderPassInfo._16_8_ =
       ((long)attachmentDescriptions.
              super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)attachmentDescriptions.
             super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x24 << 0x20;
  renderPassInfo.pAttachments =
       attachmentDescriptions.
       super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  renderPassInfo.subpassCount =
       (deUint32)
       (((long)subpasses.
               super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)subpasses.
              super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  renderPassInfo.pSubpasses =
       subpasses.
       super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
       _M_impl.super__Vector_impl_data._M_start;
  renderPassInfo._48_8_ = renderPassInfo._48_8_ & 0xffffffff00000000;
  renderPassInfo.pDependencies = (VkSubpassDependency *)0x0;
  ::vk::createRenderPass
            (__return_storage_ptr__,vk,device,&renderPassInfo,(VkAllocationCallbacks *)0x0);
  std::_Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::
  ~_Vector_base(&subpasses.
                 super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
               );
  std::_Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
  ~_Vector_base(&depthStencilAttachmentReferences.
                 super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
               );
  std::_Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
  ~_Vector_base(&colorAttachmentReferences.
                 super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
               );
  std::_Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
  ~_Vector_base(&attachmentDescriptions.
                 super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
               );
  return __return_storage_ptr__;
}

Assistant:

Move<VkRenderPass> makeRenderPass (const DeviceInterface&		vk,
								   const VkDevice				device,
								   const VkFormat				colorFormat,
								   const VkFormat				depthStencilFormat,
								   const deUint32				numLayers,
								   const VkImageLayout			initialColorImageLayout			= VK_IMAGE_LAYOUT_UNDEFINED,
								   const VkImageLayout			initialDepthStencilImageLayout	= VK_IMAGE_LAYOUT_UNDEFINED)
{
	const VkAttachmentDescription colorAttachmentDescription =
	{
		(VkAttachmentDescriptionFlags)0,					// VkAttachmentDescriptionFlags		flags;
		colorFormat,										// VkFormat							format;
		VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
		VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
		initialColorImageLayout,							// VkImageLayout					initialLayout;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout					finalLayout;
	};
	vector<VkAttachmentDescription> attachmentDescriptions(numLayers, colorAttachmentDescription);

	const VkAttachmentDescription depthStencilAttachmentDescription =
	{
		(VkAttachmentDescriptionFlags)0,					// VkAttachmentDescriptionFlags		flags;
		depthStencilFormat,									// VkFormat							format;
		VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				storeOp;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
		initialDepthStencilImageLayout,						// VkImageLayout					initialLayout;
		VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout					finalLayout;
	};

	if (depthStencilFormat != VK_FORMAT_UNDEFINED)
		attachmentDescriptions.insert(attachmentDescriptions.end(), numLayers, depthStencilAttachmentDescription);

	// Create a subpass for each attachment (each attachement is a layer of an arrayed image).
	vector<VkAttachmentReference>	colorAttachmentReferences		(numLayers);
	vector<VkAttachmentReference>	depthStencilAttachmentReferences(numLayers);
	vector<VkSubpassDescription>	subpasses;

	// Ordering here must match the framebuffer attachments
	for (deUint32 i = 0; i < numLayers; ++i)
	{
		const VkAttachmentReference attachmentRef =
		{
			i,													// deUint32			attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL			// VkImageLayout	layout;
		};
		const VkAttachmentReference depthStencilAttachmentRef =
		{
			i + numLayers,										// deUint32			attachment;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL	// VkImageLayout	layout;
		};

		colorAttachmentReferences[i]		= attachmentRef;
		depthStencilAttachmentReferences[i]	= depthStencilAttachmentRef;

		const VkAttachmentReference*	pDepthStencilAttachment	= (depthStencilFormat != VK_FORMAT_UNDEFINED ? &depthStencilAttachmentReferences[i] : DE_NULL);
		const VkSubpassDescription		subpassDescription		=
		{
			(VkSubpassDescriptionFlags)0,					// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,				// VkPipelineBindPoint				pipelineBindPoint;
			0u,												// deUint32							inputAttachmentCount;
			DE_NULL,										// const VkAttachmentReference*		pInputAttachments;
			1u,												// deUint32							colorAttachmentCount;
			&colorAttachmentReferences[i],					// const VkAttachmentReference*		pColorAttachments;
			DE_NULL,										// const VkAttachmentReference*		pResolveAttachments;
			pDepthStencilAttachment,						// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,												// deUint32							preserveAttachmentCount;
			DE_NULL											// const deUint32*					pPreserveAttachments;
		};
		subpasses.push_back(subpassDescription);
	}

	const VkRenderPassCreateInfo renderPassInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,				// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		(VkRenderPassCreateFlags)0,								// VkRenderPassCreateFlags			flags;
		static_cast<deUint32>(attachmentDescriptions.size()),	// deUint32							attachmentCount;
		&attachmentDescriptions[0],								// const VkAttachmentDescription*	pAttachments;
		static_cast<deUint32>(subpasses.size()),				// deUint32							subpassCount;
		&subpasses[0],											// const VkSubpassDescription*		pSubpasses;
		0u,														// deUint32							dependencyCount;
		DE_NULL													// const VkSubpassDependency*		pDependencies;
	};

	return createRenderPass(vk, device, &renderPassInfo);
}